

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O3

void anon_unknown.dwarf_273abf::SeedStrengthen(CSHA512 *hasher,RNGState *rng,duration dur)

{
  ulong uVar1;
  long lVar2;
  CSHA512 *pCVar3;
  long lVar4;
  int i;
  int iVar5;
  long in_FS_OFFSET;
  uchar strengthen_seed [32];
  uchar buffer [64];
  CSHA512 inner_hasher;
  ulong local_170;
  uchar local_168 [32];
  uchar local_148 [72];
  CSHA512 local_100;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memcpy(&local_100,hasher,200);
  RNGState::MixExtract(rng,local_168,0x20,&local_100,false,true);
  CSHA512::CSHA512(&local_100);
  CSHA512::Write(&local_100,local_168,0x20);
  lVar2 = std::chrono::_V2::steady_clock::now();
  iVar5 = 0;
  do {
    do {
      CSHA512::Finalize(&local_100,local_148);
      CSHA512::Reset(&local_100);
      pCVar3 = CSHA512::Write(&local_100,local_148,0x40);
      iVar5 = iVar5 + 1;
    } while (iVar5 != 1000);
    uVar1 = rdtsc();
    local_170 = uVar1 & 0xffffffff00000000 | CONCAT44((int)((ulong)pCVar3 >> 0x20),(int)uVar1);
    CSHA512::Write(hasher,(uchar *)&local_170,8);
    lVar4 = std::chrono::_V2::steady_clock::now();
    iVar5 = 0;
  } while (lVar4 < lVar2 + dur.__r);
  CSHA512::Finalize(&local_100,local_148);
  CSHA512::Write(hasher,local_148,0x40);
  CSHA512::Reset(&local_100);
  memory_cleanse(local_148,0x40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SeedStrengthen(CSHA512& hasher, RNGState& rng, SteadyClock::duration dur) noexcept
{
    // Generate 32 bytes of entropy from the RNG, and a copy of the entropy already in hasher.
    // Never use the deterministic PRNG for this, as the result is only used internally.
    unsigned char strengthen_seed[32];
    rng.MixExtract(strengthen_seed, sizeof(strengthen_seed), CSHA512(hasher), false, /*always_use_real_rng=*/true);
    // Strengthen the seed, and feed it into hasher.
    Strengthen(strengthen_seed, dur, hasher);
}